

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EGP.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Sys::Policies::EGP::create
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,EGP *this,Path *path,Parameters *parameters)

{
  Client *client;
  Url local_40;
  
  client = *(Client **)this;
  getUrl(&local_40,this,path);
  Policies::create(__return_storage_ptr__,client,&local_40,parameters);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Vault::Sys::Policies::EGP::create(const Path &path,
                                  const Parameters &parameters) {
  return Vault::Sys::Policies::create(client_, getUrl(path), parameters);
}